

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxWhileLoop::Emit(FxWhileLoop *this,VMFunctionBuilder *build)

{
  bool bVar1;
  uint uVar2;
  size_t target;
  size_t sVar3;
  undefined1 local_70 [40];
  TArray<unsigned_long,_unsigned_long> no;
  TArray<unsigned_long,_unsigned_long> yes;
  size_t loopend;
  size_t loopstart;
  VMFunctionBuilder *build_local;
  FxWhileLoop *this_local;
  
  if (this->Condition->ValueType != (PType *)TypeBool) {
    __assert_fail("Condition->ValueType == TypeBool",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x237c,"virtual ExpEmit FxWhileLoop::Emit(VMFunctionBuilder *)");
  }
  TArray<unsigned_long,_unsigned_long>::TArray((TArray<unsigned_long,_unsigned_long> *)&no.Most);
  TArray<unsigned_long,_unsigned_long>::TArray
            ((TArray<unsigned_long,_unsigned_long> *)(local_70 + 0x20));
  target = VMFunctionBuilder::GetAddress(build);
  uVar2 = (*this->Condition->_vptr_FxExpression[3])();
  if ((uVar2 & 1) == 0) {
    (*this->Condition->_vptr_FxExpression[10])(this->Condition,build,0,&no.Most,local_70 + 0x20);
  }
  else {
    FxConstant::GetValue((FxConstant *)local_70);
    bVar1 = ExpVal::GetBool((ExpVal *)local_70);
    if (!bVar1) {
      __assert_fail("static_cast<FxConstant *>(Condition)->GetValue().GetBool() == true",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x2387,"virtual ExpEmit FxWhileLoop::Emit(VMFunctionBuilder *)");
    }
    ExpVal::~ExpVal((ExpVal *)local_70);
  }
  VMFunctionBuilder::BackpatchListToHere(build,(TArray<unsigned_long,_unsigned_long> *)&no.Most);
  if (this->Code != (FxExpression *)0x0) {
    FxExpression::EmitStatement(this->Code,build);
  }
  sVar3 = VMFunctionBuilder::Emit(build,0x44,0);
  VMFunctionBuilder::Backpatch(build,sVar3,target);
  VMFunctionBuilder::BackpatchListToHere
            (build,(TArray<unsigned_long,_unsigned_long> *)(local_70 + 0x20));
  sVar3 = VMFunctionBuilder::GetAddress(build);
  FxLoopStatement::Backpatch(&this->super_FxLoopStatement,build,target,sVar3);
  ExpEmit::ExpEmit((ExpEmit *)&this_local);
  TArray<unsigned_long,_unsigned_long>::~TArray
            ((TArray<unsigned_long,_unsigned_long> *)(local_70 + 0x20));
  TArray<unsigned_long,_unsigned_long>::~TArray((TArray<unsigned_long,_unsigned_long> *)&no.Most);
  return (ExpEmit)this_local;
}

Assistant:

ExpEmit FxWhileLoop::Emit(VMFunctionBuilder *build)
{
	assert(Condition->ValueType == TypeBool);

	size_t loopstart, loopend;
	TArray<size_t> yes, no;

	// Evaluate the condition and execute/break out of the loop.
	loopstart = build->GetAddress();
	if (!Condition->isConstant())
	{
		Condition->EmitCompare(build, false, yes, no);
	}
	else assert(static_cast<FxConstant *>(Condition)->GetValue().GetBool() == true);

	build->BackpatchListToHere(yes);
	// Execute the loop's content.
	if (Code != nullptr)
	{
		Code->EmitStatement(build);
	}

	// Loop back.
	build->Backpatch(build->Emit(OP_JMP, 0), loopstart);
	build->BackpatchListToHere(no);
	loopend = build->GetAddress();
	Backpatch(build, loopstart, loopend);
	return ExpEmit();
}